

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O2

bool v_scroll_active_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Object group;
  Am_Object local_20;
  Am_Object local_18;
  
  Am_Object::Get_Owner(&group,(Am_Slot_Flags)self);
  pAVar4 = Am_Object::Get(&group,0xcc,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar4);
  if (bVar1) {
    pAVar4 = Am_Object::Get(&group,399,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = Am_Object::Get(&group,0x1c2,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    bVar1 = true;
    if (iVar3 <= iVar2) goto LAB_00272240;
  }
  bVar1 = Am_Object::Valid(&group);
  if (bVar1) {
    Am_Object::Set(&group,0x11e,0,0);
    Am_Object::Get_Object(&local_20,(Am_Slot_Key)&group,0x1c4);
    Am_Object::Get_Object(&local_18,(Am_Slot_Key)&local_20,0xc5);
    Am_Object::Set(&local_18,0x169,0,0);
    Am_Object::~Am_Object(&local_18);
    Am_Object::~Am_Object(&local_20);
  }
  bVar1 = false;
LAB_00272240:
  Am_Object::~Am_Object(&group);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, v_scroll_active)
{
  Am_Object group = self.Get_Owner();
  if ((bool)group.Get(Am_ACTIVE) &&
      ((int)group.Get(Am_INNER_HEIGHT) >= (int)group.Get(Am_CLIP_HEIGHT)))
    return true;
  else {
    if (group.Valid()) {
      group.Set(Am_Y_OFFSET, 0); //make sure at origin when go inactive
      group.Get_Object(Am_V_SCROLLER, Am_NO_DEPENDENCY)
          .Get_Object(Am_COMMAND, Am_NO_DEPENDENCY)
          .Set(Am_VALUE, 0);
    }
    return false;
  }
}